

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Constellation(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement *pCVar6;
  _List_node_base *p_Var7;
  undefined8 extraout_RAX;
  AMFImporter *this_00;
  char *__end;
  uint uVar8;
  ulong uVar9;
  pointer pcVar10;
  string an;
  string id;
  undefined1 local_80 [39];
  allocator<char> local_59;
  _Base_ptr local_58;
  char *local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  CAMFImporter_NodeElement *local_38;
  
  local_58 = (_Base_ptr)&local_48;
  local_50 = (char *)0x0;
  local_48 = _S_red;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_80,(char *)CONCAT44(extraout_var,iVar5),&local_59);
      iVar5 = std::__cxx11::string::compare((char *)local_80);
      if (iVar5 != 0) goto LAB_003de275;
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      pcVar3 = local_50;
      strlen((char *)CONCAT44(extraout_var_00,iVar5));
      std::__cxx11::string::_M_replace((ulong)&local_58,0,pcVar3,CONCAT44(extraout_var_00,iVar5));
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar4 != uVar8);
  }
  pcVar10 = local_80 + 0x10;
  pCVar6 = (CAMFImporter_NodeElement *)operator_new(0x50);
  pCVar2 = this->mNodeElement_Cur;
  pCVar6->Type = 1;
  (pCVar6->ID)._M_dataplus._M_p = (pointer)&(pCVar6->ID).field_2;
  (pCVar6->ID)._M_string_length = 0;
  (pCVar6->ID).field_2._M_local_buf[0] = '\0';
  pCVar6->Parent = pCVar2;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pCVar6->Child;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pCVar6->Child;
  (pCVar6->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pCVar6->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_0080e3f8;
  if (local_50 != (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&pCVar6->ID);
  }
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  pCVar2 = this->mNodeElement_Cur;
  if ((char)iVar5 == '\0') {
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pCVar6;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->mNodeElement_Cur = pCVar6;
    local_38 = pCVar6;
LAB_003de054:
    do {
      do {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar5 == '\0') {
          this_00 = (AMFImporter *)local_80;
          local_80._0_8_ = pcVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"constellation","");
          Throw_CloseNotFound(this_00,(string *)local_80);
LAB_003de275:
          Throw_IncorrectAttr(this,(string *)local_80);
          if (local_58 != (_Base_ptr)&local_48) {
            operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
          }
          _Unwind_Resume(extraout_RAX);
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar5 == 1) {
          local_80._0_8_ = pcVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"instance","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)local_80);
          if ((pointer)local_80._0_8_ != pcVar10) {
            operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
          }
          if (iVar5 == 0) {
            ParseNode_Instance(this);
          }
          else {
            local_80._0_8_ = pcVar10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"metadata","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)local_80);
            if ((pointer)local_80._0_8_ != pcVar10) {
              operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
            }
            if (iVar5 == 0) {
              ParseNode_Metadata(this);
            }
            else {
              local_80._0_8_ = pcVar10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"constellation","")
              ;
              XML_CheckNode_SkipUnsupported(this,(string *)local_80);
              if ((pointer)local_80._0_8_ != pcVar10) {
                operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
              }
            }
          }
          goto LAB_003de054;
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar5 != 2);
      local_80._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"constellation","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar5 = std::__cxx11::string::compare((char *)local_80);
      if ((pointer)local_80._0_8_ != pcVar10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
    } while (iVar5 != 0);
    pCVar6 = local_38;
    if (this->mNodeElement_Cur != (CAMFImporter_NodeElement *)0x0) {
      this->mNodeElement_Cur = this->mNodeElement_Cur->Parent;
    }
  }
  else {
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pCVar6;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)pCVar6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_58 != (_Base_ptr)&local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Constellation()
{
    std::string id;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <constellation>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create and if needed - define new grouping object.
	ne = new CAMFImporter_NodeElement_Constellation(mNodeElement_Cur);

	CAMFImporter_NodeElement_Constellation& als = *((CAMFImporter_NodeElement_Constellation*)ne);// alias for convenience

	if(!id.empty()) als.ID = id;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("constellation");
			if(XML_CheckNode_NameEqual("instance")) { ParseNode_Instance(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("constellation");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}